

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = CONCAT22(in_register_0000003a,kind) - 0x8e;
  if (((0x3e < uVar1) || ((0x700000000007ffffU >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     ((0x12 < CONCAT22(in_register_0000003a,kind) || ((0x54000U >> (kind & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isCloseDelimOrKeyword(TokenKind kind) {
    switch (kind) {
        case TokenKind::CloseBrace:
        case TokenKind::CloseBracket:
        case TokenKind::CloseParenthesis:
            return true;
        default:
            return isEndKeyword(kind);
    }
}